

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::HeapEntry<duckdb::string_t>::Assign
          (HeapEntry<duckdb::string_t> *this,ArenaAllocator *allocator,string_t *new_val)

{
  uint uVar1;
  undefined4 uVar2;
  data_ptr_t pdVar3;
  uint64_t len;
  InvalidInputException *this_00;
  ulong uVar4;
  uint uVar5;
  size_t v;
  char *pcVar6;
  allocator local_49;
  string local_48;
  
  uVar5 = (new_val->value).pointer.length;
  v = (size_t)uVar5;
  if (v < 0xd) {
    pcVar6 = (new_val->value).pointer.ptr;
    *(undefined8 *)&(this->value).value = *(undefined8 *)&new_val->value;
    (this->value).value.pointer.ptr = pcVar6;
  }
  else {
    pdVar3 = this->allocated_data;
    if (pdVar3 == (data_ptr_t)0x0) {
      len = NextPowerOfTwo(v);
      if (len >> 0x20 != 0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_48,"Resulting string/blob too large!",&local_49);
        InvalidInputException::InvalidInputException(this_00,&local_48);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this->capacity = (uint32_t)len;
      pdVar3 = ArenaAllocator::Allocate(allocator,len);
      this->allocated_data = pdVar3;
      if ((new_val->value).pointer.length < 0xd) {
        pcVar6 = (char *)((long)&new_val->value + 4);
      }
      else {
        pcVar6 = (new_val->value).pointer.ptr;
      }
      switchD_0193dc74::default(pdVar3,pcVar6,v);
      pdVar3 = this->allocated_data;
      uVar2 = *(undefined4 *)pdVar3;
      (this->value).value.pointer.length = uVar5;
      *(undefined4 *)((long)&(this->value).value + 4) = uVar2;
      (this->value).value.pointer.ptr = (char *)pdVar3;
    }
    else {
      uVar1 = this->capacity;
      uVar4 = (ulong)uVar1;
      if (uVar1 < uVar5) {
        do {
          uVar5 = (int)uVar4 * 2;
          this->capacity = uVar5;
          uVar4 = (ulong)uVar5;
        } while (uVar5 < (new_val->value).pointer.length);
        pdVar3 = ArenaAllocator::Reallocate(allocator,pdVar3,(ulong)uVar1,(ulong)uVar5);
        this->allocated_data = pdVar3;
        v = (size_t)(new_val->value).pointer.length;
      }
      uVar5 = (uint)v;
      if (uVar5 < 0xd) {
        pcVar6 = (char *)((long)&new_val->value + 4);
      }
      else {
        pcVar6 = (new_val->value).pointer.ptr;
      }
      switchD_0193dc74::default(pdVar3,pcVar6,v);
      pdVar3 = this->allocated_data;
      if (uVar5 < 0xd) {
        local_48._M_string_length._0_4_ = 0;
        local_48._M_dataplus._M_p._0_4_ = 0;
        local_48._M_dataplus._M_p._4_4_ = 0;
        if (uVar5 != 0) {
          switchD_0193dc74::default(&local_48,pdVar3,v);
        }
      }
      else {
        local_48._M_dataplus._M_p._0_4_ = *(undefined4 *)pdVar3;
        local_48._M_dataplus._M_p._4_4_ = SUB84(pdVar3,0);
        local_48._M_string_length._0_4_ = (undefined4)((ulong)pdVar3 >> 0x20);
      }
      (this->value).value.pointer.length = uVar5;
      *(ulong *)((long)&(this->value).value + 4) =
           CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_);
      *(undefined4 *)((long)&(this->value).value + 0xc) = (undefined4)local_48._M_string_length;
    }
  }
  return;
}

Assistant:

void Assign(ArenaAllocator &allocator, const string_t &new_val) {
		if (new_val.IsInlined()) {
			value = new_val;
			return;
		}

		// Short path for first assignment
		if (allocated_data == nullptr) {
			auto new_size = UnsafeNumericCast<uint32_t>(new_val.GetSize());
			auto new_capacity = NextPowerOfTwo(new_size);
			if (new_capacity > string_t::MAX_STRING_SIZE) {
				throw InvalidInputException("Resulting string/blob too large!");
			}
			capacity = UnsafeNumericCast<uint32_t>(new_capacity);
			allocated_data = allocator.Allocate(capacity);
			memcpy(allocated_data, new_val.GetData(), new_size);
			value = string_t(const_char_ptr_cast(allocated_data), new_size);
			return;
		}

		// double allocation until value fits
		if (capacity < new_val.GetSize()) {
			auto old_size = capacity;
			capacity *= 2;
			while (capacity < new_val.GetSize()) {
				capacity *= 2;
			}
			allocated_data = allocator.Reallocate(allocated_data, old_size, capacity);
		}
		auto new_size = UnsafeNumericCast<uint32_t>(new_val.GetSize());
		memcpy(allocated_data, new_val.GetData(), new_size);
		value = string_t(const_char_ptr_cast(allocated_data), new_size);
	}